

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grades.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  char *__nptr;
  long lVar4;
  long lVar5;
  long lVar6;
  long grade;
  char *stopped;
  string local_48 [8];
  string input;
  int local_28 [2];
  int gradeArray [6];
  bool continueGrading;
  
  gradeArray[5] = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Welcome to the grading program!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Please type each grade, followed by the return key.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Grades can be in the range of 0-5. Type \'exit\' to leave.");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  gradeArray[4]._3_1_ = 1;
  memset(local_28,0,0x18);
  do {
    std::__cxx11::string::string(local_48);
    std::operator<<((ostream *)&std::cout,"Grade: ");
    std::operator>>((istream *)&std::cin,local_48);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"exit");
    if (bVar2) {
      printGrades(local_28,6);
      gradeArray[4]._3_1_ = 0;
      stopped._0_4_ = 3;
    }
    else {
      __nptr = (char *)std::__cxx11::string::c_str();
      lVar4 = strtol(__nptr,(char **)&grade,10);
      lVar1 = grade;
      lVar5 = std::__cxx11::string::c_str();
      lVar6 = std::__cxx11::string::length();
      if ((ulong)lVar1 < (ulong)(lVar5 + lVar6)) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Invalid non-numeric string!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        stopped._0_4_ = 3;
      }
      else if ((lVar4 < 0) || (5 < lVar4)) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Invalid grade number. Please enter a number between 0 and ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        stopped._0_4_ = 3;
      }
      else {
        addGrade((int)lVar4,local_28);
        stopped._0_4_ = 0;
      }
    }
    std::__cxx11::string::~string(local_48);
  } while ((gradeArray[4]._3_1_ & 1) != 0);
  return gradeArray[5];
}

Assistant:

int main()
{
    cout << "Welcome to the grading program!" << endl;
    cout << "Please type each grade, followed by the return key." << endl;
    cout << "Grades can be in the range of 0-5. Type 'exit' to leave." << endl << endl;

    bool continueGrading = true;
    int gradeArray[NUM_GRADE_COLUMNS] = { 0 };

    do
    {
        string input;
        cout << "Grade: ";
        cin >> input;

        if(input == "exit")
        {
            printGrades(gradeArray, NUM_GRADE_COLUMNS);
            continueGrading = false;
            continue;
        }

        char* stopped;
        long grade = strtol(input.c_str(), &stopped, 10);


        //we can use pointer arithmetic in order to figure out if strtol stopped before the end of the string
        //This is documented in the c++ online reference. If it reads in the whole string it should be pointing
        //At the \0 (end) of the string

        if(stopped >= (input.c_str() + input.length()))
        {
            if(grade >= 0 && grade < NUM_GRADE_COLUMNS)
            {
                addGrade(static_cast<int>(grade), gradeArray);
            }
            else
            {
                cout << "Invalid grade number. Please enter a number between 0 and " << (NUM_GRADE_COLUMNS - 1) << endl;
                continue;
            }
        }
        else
        {
            cout << "Invalid non-numeric string!" << endl;
            continue;
        }




    }
    while(continueGrading);
}